

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O2

ChainstateLoadResult *
node::LoadChainstate
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  _Head_base<0UL,_Chainstate_*,_false> _Var5;
  string_view source_file;
  string original;
  string original_00;
  bool bVar6;
  SnapshotCompletionResult SVar7;
  base_blob<256U> *this;
  base_blob<256u> *this_00;
  arith_uint256 *this_01;
  base_uint<256U> *a;
  Logger *pLVar8;
  Chainstate *this_02;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view str;
  string_view logging_function_06;
  Level in_stack_fffffffffffffe58;
  undefined4 uVar10;
  string *__return_storage_ptr___00;
  string *__return_storage_ptr___01;
  undefined4 uVar11;
  char *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ulong local_178 [2];
  ChainstateLoadResult local_168;
  string local_120 [32];
  string log_msg;
  ChainstateLoadStatus local_c0 [2];
  string local_b8 [32];
  allocator<char> local_98 [32];
  ChainstateLoadStatus local_78 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this = &ChainstateManager::AssumedValidBlock(chainman)->super_base_blob<256U>;
  bVar6 = base_blob<256U>::IsNull(this);
  if (bVar6) {
    logging_function._M_str = "LoadChainstate";
    logging_function._M_len = 0xe;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_00._M_len = 0x5c;
    ::LogPrintf_<>(logging_function,source_file_00,0xa8,
                   I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ESTIMATEFEE|WALLETDB|BENCH|TOR|NET,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
  }
  else {
    this_00 = (base_blob<256u> *)ChainstateManager::AssumedValidBlock(chainman);
    base_blob<256u>::GetHex_abi_cxx11_(&log_msg,this_00);
    logging_function_00._M_str = "LoadChainstate";
    logging_function_00._M_len = 0xe;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_01._M_len = 0x5c;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_01,0xa6,
               I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ESTIMATEFEE|BENCH|HTTP|MEMPOOL,
               (Level)&log_msg,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  this_01 = ChainstateManager::MinimumChainWork(chainman);
  __return_storage_ptr___00 = &log_msg;
  base_uint<256u>::GetHex_abi_cxx11_(__return_storage_ptr___00,this_01);
  logging_function_01._M_str = "LoadChainstate";
  logging_function_01._M_len = 0xe;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
  ;
  source_file_02._M_len = 0x5c;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function_01,source_file_02,0xaa,
             I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ESTIMATEFEE|WALLETDB|ZMQ|BENCH|HTTP|TOR,
             (Level)__return_storage_ptr___00,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string((string *)&log_msg);
  a = &ChainstateManager::MinimumChainWork(chainman)->super_base_uint<256U>;
  __return_storage_ptr___01 = &log_msg;
  UintToArith256((arith_uint256 *)__return_storage_ptr___01,
                 &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
  bVar6 = ::operator<(a,(base_uint<256U> *)__return_storage_ptr___01);
  if (bVar6) {
    base_blob<256u>::GetHex_abi_cxx11_
              (__return_storage_ptr___01,
               (base_blob<256u> *)
               &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
    logging_function_02._M_str = "LoadChainstate";
    logging_function_02._M_len = 0xe;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_03._M_len = 0x5c;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_03,0xac,
               I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ESTIMATEFEE|RPC|BENCH|HTTP,
               (Level)__return_storage_ptr___01,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68)
    ;
    __return_storage_ptr___00 = __return_storage_ptr___01;
    std::__cxx11::string::~string((string *)&log_msg);
  }
  uVar4 = (chainman->m_blockman).m_opts.prune_target;
  if (uVar4 != 0) {
    if (uVar4 == 0xffffffffffffffff) {
      logging_function_03._M_str = "LoadChainstate";
      logging_function_03._M_len = 0xe;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_04._M_len = 0x5c;
      ::LogPrintf_<>(logging_function_03,source_file_04,0xaf,
                     I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ESTIMATEFEE|RPC|WALLETDB|BENCH|TOR,
                     (Level)__return_storage_ptr___00,in_stack_fffffffffffffe60);
    }
    else {
      local_178[0] = uVar4 >> 0x14;
      pLVar8 = LogInstance();
      bVar6 = BCLog::Logger::Enabled(pLVar8);
      if (bVar6) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<unsigned_long>
                  ((string *)&local_168,
                   "Prune configured to target %u MiB on disk for block and undo files.\n",local_178
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_168);
        std::__cxx11::string::~string((string *)&local_168);
        pLVar8 = LogInstance();
        local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_dataplus._M_p = (pointer)0x5c;
        local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
        super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
        _M_head_impl.original._M_string_length = 0x6a28bf;
        uVar10 = 0x5c;
        uVar11 = 0;
        in_stack_fffffffffffffe60 =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        in_stack_fffffffffffffe70 = 2;
        in_stack_fffffffffffffe68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
        ;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
        ;
        source_file._M_len = 0x5c;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function_06._M_str = "LoadChainstate";
        logging_function_06._M_len = 0xe;
        BCLog::Logger::LogPrintStr(pLVar8,str,logging_function_06,source_file,0xb1,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
        __return_storage_ptr___00 = (string *)CONCAT44(uVar11,uVar10);
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
             ,0xb4,false);
  uVar1 = cache_sizes->coins_db;
  uVar2 = cache_sizes->coins;
  auVar9._8_4_ = (int)uVar1;
  auVar9._0_8_ = uVar2;
  auVar9._12_4_ = (int)((ulong)uVar1 >> 0x20);
  chainman->m_total_coinstip_cache = uVar2;
  chainman->m_total_coinsdb_cache = auVar9._8_8_;
  ChainstateManager::InitializeChainstate(chainman,options->mempool);
  bVar6 = ChainstateManager::DetectSnapshotChainstate(chainman);
  if ((bVar6) && (options->wipe_chainstate_db == true)) {
    logging_function_04._M_str = "LoadChainstate";
    logging_function_04._M_len = 0xe;
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_05._M_len = 0x5c;
    ::LogPrintf_<>(logging_function_04,source_file_05,0xc0,
                   I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ADDRMAN|WALLETDB|ZMQ|BENCH|HTTP|MEMPOOL|
                   NET,(Level)__return_storage_ptr___00,in_stack_fffffffffffffe60);
    bVar6 = ChainstateManager::DeleteSnapshotChainstate(chainman);
    if (!bVar6) {
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p._0_4_ = 2;
      std::__cxx11::string::string<std::allocator<char>>
                (local_b8,"Couldn\'t remove snapshot chainstate.",(allocator<char> *)local_78);
      original._M_string_length = (size_type)in_stack_fffffffffffffe60;
      original._M_dataplus._M_p = (pointer)__return_storage_ptr___00;
      original.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe68;
      original.field_2._8_4_ = in_stack_fffffffffffffe70;
      original.field_2._12_4_ = in_stack_fffffffffffffe74;
      Untranslated((bilingual_str *)&log_msg,original);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                (__return_storage_ptr__,(ChainstateLoadStatus *)&local_168,(bilingual_str *)&log_msg
                );
      bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
      std::__cxx11::string::~string(local_b8);
      goto LAB_001f48d7;
    }
  }
  CompleteChainstateInitialization((ChainstateLoadResult *)&log_msg,chainman,cache_sizes,options);
  if (local_c0[0] == SUCCESS) {
    SVar7 = ChainstateManager::MaybeCompleteSnapshotValidation(chainman);
    if (SVar7 == SUCCESS) {
      logging_function_05._M_str = "LoadChainstate";
      logging_function_05._M_len = 0xe;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_06._M_len = 0x5c;
      ::LogPrintf_<>(logging_function_05,source_file_06,0xd8,
                     I2P|VALIDATION|QT|LIBEVENT|RAND|REINDEX|ADDRMAN|RPC|WALLETDB|BENCH|HTTP|MEMPOOL
                     |NET,(Level)__return_storage_ptr___00,in_stack_fffffffffffffe60);
      bVar6 = ChainstateManager::ValidatedSnapshotCleanup(chainman);
      if (!bVar6) {
        local_78[0] = FAILURE_FATAL;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_120,"Background chainstate cleanup failed unexpectedly.",local_98);
        original_00._M_string_length = (size_type)in_stack_fffffffffffffe60;
        original_00._M_dataplus._M_p = (pointer)__return_storage_ptr___00;
        original_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe68;
        original_00.field_2._8_4_ = in_stack_fffffffffffffe70;
        original_00.field_2._12_4_ = in_stack_fffffffffffffe74;
        Untranslated((bilingual_str *)&local_168,original_00);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  (__return_storage_ptr__,local_78,(bilingual_str *)&local_168);
        bilingual_str::~bilingual_str((bilingual_str *)&local_168);
        std::__cxx11::string::~string(local_120);
        goto LAB_001f48ca;
      }
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_168,chainman);
      if (local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
          super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p !=
          (pointer)local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original._M_string_length) {
        __assert_fail("chainman.GetAll().empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe0,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_168);
      bVar6 = ChainstateManager::IsSnapshotActive(chainman);
      if (bVar6) {
        __assert_fail("!chainman.IsSnapshotActive()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe1,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      if ((((chainman->m_snapshot_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
          (_Var5._M_head_impl =
                (chainman->m_ibd_chainstate)._M_t.
                super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
          _Var5._M_head_impl != (Chainstate *)0x0)) && ((_Var5._M_head_impl)->m_disabled == true)) {
        __assert_fail("!chainman.IsSnapshotValidated()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe2,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      ChainstateManager::InitializeChainstate(chainman,options->mempool);
      this_02 = ChainstateManager::ActiveChainstate(chainman);
      Chainstate::ClearBlockIndexCandidates(this_02);
      CompleteChainstateInitialization(&local_168,chainman,cache_sizes,options);
      if (local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
          super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl == SUCCESS) {
        bilingual_str::~bilingual_str((bilingual_str *)&local_168);
        goto LAB_001f470a;
      }
      std::_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str>::
      _Tuple_impl<node::ChainstateLoadStatus&,bilingual_str&,void>
                ((_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str> *)__return_storage_ptr__
                 ,&local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                   super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl,
                 (bilingual_str *)&local_168);
    }
    else if (SVar7 == SKIPPED) {
LAB_001f470a:
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p =
           (pointer)((long)&local_168.
                            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                            super__Tuple_impl<1UL,_bilingual_str>.
                            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.original + 0x10
                    );
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_string_length = 0;
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original.field_2._M_local_buf[0] = '\0';
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p =
           (pointer)((long)&local_168.
                            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                            super__Tuple_impl<1UL,_bilingual_str>.
                            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl.translated +
                    0x10);
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_string_length = 0;
      local_168.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated.field_2._M_local_buf[0] = '\0';
      bilingual_str::bilingual_str
                ((bilingual_str *)__return_storage_ptr__,(bilingual_str *)&local_168);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
    }
    else {
      local_78[0] = FAILURE;
      _((bilingual_str *)&local_168,(ConstevalStringLiteral)0x6a2c25);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                (__return_storage_ptr__,local_78,(bilingual_str *)&local_168);
    }
    bilingual_str::~bilingual_str((bilingual_str *)&local_168);
  }
  else {
    std::_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str>::
    _Tuple_impl<node::ChainstateLoadStatus&,bilingual_str&,void>
              ((_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str> *)__return_storage_ptr__,
               local_c0,(bilingual_str *)&log_msg);
  }
LAB_001f48ca:
  bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
LAB_001f48d7:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ChainstateLoadResult LoadChainstate(ChainstateManager& chainman, const CacheSizes& cache_sizes,
                                    const ChainstateLoadOptions& options)
{
    if (!chainman.AssumedValidBlock().IsNull()) {
        LogPrintf("Assuming ancestors of block %s have valid signatures.\n", chainman.AssumedValidBlock().GetHex());
    } else {
        LogPrintf("Validating signatures for all blocks.\n");
    }
    LogPrintf("Setting nMinimumChainWork=%s\n", chainman.MinimumChainWork().GetHex());
    if (chainman.MinimumChainWork() < UintToArith256(chainman.GetConsensus().nMinimumChainWork)) {
        LogPrintf("Warning: nMinimumChainWork set below default value of %s\n", chainman.GetConsensus().nMinimumChainWork.GetHex());
    }
    if (chainman.m_blockman.GetPruneTarget() == BlockManager::PRUNE_TARGET_MANUAL) {
        LogPrintf("Block pruning enabled.  Use RPC call pruneblockchain(height) to manually prune block and undo files.\n");
    } else if (chainman.m_blockman.GetPruneTarget()) {
        LogPrintf("Prune configured to target %u MiB on disk for block and undo files.\n", chainman.m_blockman.GetPruneTarget() / 1024 / 1024);
    }

    LOCK(cs_main);

    chainman.m_total_coinstip_cache = cache_sizes.coins;
    chainman.m_total_coinsdb_cache = cache_sizes.coins_db;

    // Load the fully validated chainstate.
    chainman.InitializeChainstate(options.mempool);

    // Load a chain created from a UTXO snapshot, if any exist.
    bool has_snapshot = chainman.DetectSnapshotChainstate();

    if (has_snapshot && options.wipe_chainstate_db) {
        LogPrintf("[snapshot] deleting snapshot chainstate due to reindexing\n");
        if (!chainman.DeleteSnapshotChainstate()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Couldn't remove snapshot chainstate.")};
        }
    }

    auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
    if (init_status != ChainstateLoadStatus::SUCCESS) {
        return {init_status, init_error};
    }

    // If a snapshot chainstate was fully validated by a background chainstate during
    // the last run, detect it here and clean up the now-unneeded background
    // chainstate.
    //
    // Why is this cleanup done here (on subsequent restart) and not just when the
    // snapshot is actually validated? Because this entails unusual
    // filesystem operations to move leveldb data directories around, and that seems
    // too risky to do in the middle of normal runtime.
    auto snapshot_completion = chainman.MaybeCompleteSnapshotValidation();

    if (snapshot_completion == SnapshotCompletionResult::SKIPPED) {
        // do nothing; expected case
    } else if (snapshot_completion == SnapshotCompletionResult::SUCCESS) {
        LogPrintf("[snapshot] cleaning up unneeded background chainstate, then reinitializing\n");
        if (!chainman.ValidatedSnapshotCleanup()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Background chainstate cleanup failed unexpectedly.")};
        }

        // Because ValidatedSnapshotCleanup() has torn down chainstates with
        // ChainstateManager::ResetChainstates(), reinitialize them here without
        // duplicating the blockindex work above.
        assert(chainman.GetAll().empty());
        assert(!chainman.IsSnapshotActive());
        assert(!chainman.IsSnapshotValidated());

        chainman.InitializeChainstate(options.mempool);

        // A reload of the block index is required to recompute setBlockIndexCandidates
        // for the fully validated chainstate.
        chainman.ActiveChainstate().ClearBlockIndexCandidates();

        auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
        if (init_status != ChainstateLoadStatus::SUCCESS) {
            return {init_status, init_error};
        }
    } else {
        return {ChainstateLoadStatus::FAILURE, _(
           "UTXO snapshot failed to validate. "
           "Restart to resume normal initial block download, or try loading a different snapshot.")};
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}